

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::ReleaseSegment(PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                 *this,SegmentBase<Memory::PreReservedVirtualAllocWrapper> *segment)

{
  size_t *psVar1;
  undefined4 *puVar2;
  HANDLE pVVar3;
  size_t sVar4;
  code *pcVar5;
  bool bVar6;
  HANDLE pVVar7;
  undefined8 *in_FS_OFFSET;
  
  bVar6 = ValidThreadAccess(this);
  if (!bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x617,"(this->ValidThreadAccess())",
                       "Page allocation should only be used by a single thread");
    if (!bVar6) goto LAB_0025a445;
    *puVar2 = 0;
  }
  if (this->disablePageReuse != true) {
    PageTracking::ReportFree
              ((PageAllocator *)this,segment->address,segment->segmentPageCount << 0xc);
    sVar4 = segment->segmentPageCount;
    SubUsedBytes(this,sVar4 << 0xc);
    if (this->memoryData != (PageMemoryData *)0x0) {
      psVar1 = &this->memoryData->releasePageCount;
      *psVar1 = *psVar1 + sVar4;
    }
    LogFreeSegment(this,segment);
    DListBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
    RemoveElement<Memory::NoThrowHeapAllocator>
              (&this->largeSegments,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance,segment)
    ;
    return;
  }
  pVVar3 = this->processHandle;
  pVVar7 = GetCurrentProcess();
  if (pVVar3 != pVVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x61b,"(this->processHandle == GetCurrentProcess())",
                       "this->processHandle == GetCurrentProcess()");
    if (!bVar6) {
LAB_0025a445:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar2 = 0;
  }
  VirtualFree(segment->address,segment->segmentPageCount << 0xc,0x4000);
  return;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::ReleaseSegment(TSegment * segment)
{
    ASSERT_THREAD();
#ifdef RECYCLER_NO_PAGE_REUSE
    if (disablePageReuse)
    {
        Assert(this->processHandle == GetCurrentProcess());
#pragma prefast(suppress:6250, "Calling 'VirtualFree' without the MEM_RELEASE flag might free memory but not address descriptors (VADs).")
        VirtualFree(segment->GetAddress(), segment->GetPageCount() * AutoSystemInfo::PageSize, MEM_DECOMMIT);
        return;
    }
#endif
    PageTracking::ReportFree((PageAllocator*)this, segment->GetAddress(), AutoSystemInfo::PageSize * segment->GetPageCount());
    LogFreePages(segment->GetPageCount());
    LogFreeSegment(segment);
    largeSegments.RemoveElement(&NoThrowNoMemProtectHeapAllocator::Instance, segment);
}